

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O0

int lua_getstack(lua_State *L,int level,lua_Debug *ar)

{
  cTValue *pcVar1;
  cTValue *frame;
  lua_Debug *plStack_28;
  int size;
  lua_Debug *ar_local;
  lua_State *plStack_18;
  int level_local;
  lua_State *L_local;
  
  plStack_28 = ar;
  ar_local._4_4_ = level;
  plStack_18 = L;
  pcVar1 = lj_debug_frame(L,level,(int *)((long)&frame + 4));
  if (pcVar1 == (cTValue *)0x0) {
    plStack_28->i_ci = ar_local._4_4_ - frame._4_4_;
  }
  else {
    plStack_28->i_ci =
         frame._4_4_ * 0x10000 + (int)((long)((long)pcVar1 - (plStack_18->stack).ptr64) >> 3);
  }
  L_local._4_4_ = (uint)(pcVar1 != (cTValue *)0x0);
  return L_local._4_4_;
}

Assistant:

LUA_API int lua_getstack(lua_State *L, int level, lua_Debug *ar)
{
  int size;
  cTValue *frame = lj_debug_frame(L, level, &size);
  if (frame) {
    ar->i_ci = (size << 16) + (int)(frame - tvref(L->stack));
    return 1;
  } else {
    ar->i_ci = level - size;
    return 0;
  }
}